

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O3

void math::internal::matrix_gk_svd_step<double>
               (int rows,int cols,double *mat_b,double *mat_q,double *mat_p,int p,int q,
               double *epsilon)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  ulong uVar11;
  undefined1 auVar12 [8];
  double *pdVar13;
  int j;
  ulong uVar14;
  int j_1;
  uint uVar15;
  double *pdVar16;
  uint rows_a;
  double *pdVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined1 local_f8 [8];
  vector<double,_std::allocator<double>_> buffer;
  double *local_b8;
  double *local_a0;
  double local_70;
  double beta;
  double givens_c;
  double givens_s;
  ulong local_50;
  double *local_48;
  uint local_3c;
  double local_38;
  double alpha;
  
  givens_s = (double)(ulong)(uint)(cols - q);
  rows_a = (cols - q) - p;
  uVar15 = rows_a * rows_a;
  local_48 = mat_b;
  local_3c = rows;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_f8,(ulong)(uVar15 * 3),
             (allocator_type *)&local_38);
  pdVar16 = local_48;
  pdVar1 = (double *)((long)local_f8 + (ulong)uVar15 * 8);
  pdVar17 = pdVar1 + uVar15;
  if (0 < (int)rows_a) {
    uVar4 = (ulong)rows_a;
    uVar9 = (ulong)(uint)((cols + 1) * p);
    uVar11 = 0;
    auVar12 = local_f8;
    do {
      uVar14 = 0;
      do {
        *(double *)((long)auVar12 + uVar14 * 8) = local_48[(int)uVar9 + (int)uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar14 < uVar4);
      uVar11 = uVar11 + 1;
      auVar12 = (undefined1  [8])((long)auVar12 + uVar4 * 8);
      uVar9 = uVar9 + (uint)cols;
    } while (uVar11 < uVar4);
    if (0 < (int)rows_a) {
      uVar9 = 0;
      auVar12 = local_f8;
      pdVar13 = pdVar1;
      do {
        uVar11 = 0;
        pdVar6 = (double *)auVar12;
        do {
          pdVar13[uVar11] = *pdVar6;
          uVar11 = uVar11 + 1;
          pdVar6 = pdVar6 + uVar4;
        } while (uVar11 < uVar4);
        uVar9 = uVar9 + 1;
        pdVar13 = pdVar13 + uVar4;
        auVar12 = (undefined1  [8])((long)auVar12 + 8);
      } while (uVar9 < uVar4);
    }
  }
  local_50 = (ulong)(uint)cols;
  matrix_multiply<double>((double *)local_f8,rows_a,rows_a,pdVar1,rows_a,pdVar17);
  dVar2 = givens_s;
  iVar3 = (rows_a - 2) * rows_a;
  iVar7 = (rows_a - 1) * rows_a;
  dVar10 = pdVar17[(int)(iVar7 + -1 + rows_a)];
  dVar20 = pdVar17[(int)(iVar3 + rows_a + -2)] + dVar10;
  dVar18 = pdVar17[(int)(iVar3 + rows_a + -1)] * pdVar17[(int)(iVar7 + rows_a + -2)] +
           (dVar20 * dVar20 * 0.25 - pdVar17[(int)(iVar3 + rows_a + -2)] * dVar10);
  dVar19 = 0.0;
  if (0.0 < dVar18) {
    if (dVar18 < 0.0) {
      dVar19 = sqrt(dVar18);
    }
    else {
      dVar19 = SQRT(dVar18);
    }
  }
  pdVar1 = local_48;
  uVar4 = local_50;
  dVar18 = dVar20 * 0.5 - dVar19;
  dVar19 = dVar20 * 0.5 + dVar19;
  uVar9 = -(ulong)(ABS(dVar10 - dVar18) < ABS(dVar10 - dVar19));
  local_70 = pdVar16[p * cols + p];
  local_38 = local_70 * local_70 - (double)(~uVar9 & (ulong)dVar19 | (ulong)dVar18 & uVar9);
  local_70 = local_70 * pdVar16[p * cols + 1 + p];
  iVar3 = SUB84(dVar2,0) + -1;
  if (p < iVar3) {
    lVar8 = (long)cols;
    uVar9 = (ulong)local_3c;
    dVar10 = (double)(long)p;
    buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)(long)iVar3;
    local_b8 = local_48 + (long)dVar10 + 1;
    local_a0 = mat_p + (long)dVar10;
    pdVar17 = local_48 + ((long)dVar10 + 1) * lVar8;
    pdVar16 = local_48 + (long)dVar10 * lVar8;
    pdVar13 = mat_q + (long)dVar10;
    do {
      local_a0 = local_a0 + 1;
      pdVar13 = pdVar13 + 1;
      givens_s = dVar10;
      matrix_givens_rotation<double>(&local_38,&local_70,&beta,&givens_c,epsilon);
      if (0 < cols) {
        pdVar6 = local_b8;
        uVar11 = local_50;
        do {
          dVar10 = pdVar6[-1];
          pdVar6[-1] = beta * dVar10 + *pdVar6 * -givens_c;
          *pdVar6 = dVar10 * givens_c + *pdVar6 * beta;
          pdVar6 = pdVar6 + uVar4;
          uVar11 = uVar11 - 1;
          pdVar5 = local_a0;
          uVar14 = local_50;
        } while (uVar11 != 0);
        do {
          dVar10 = pdVar5[-1];
          pdVar5[-1] = beta * dVar10 + *pdVar5 * -givens_c;
          *pdVar5 = dVar10 * givens_c + *pdVar5 * beta;
          uVar14 = uVar14 - 1;
          pdVar5 = pdVar5 + uVar4;
        } while (uVar14 != 0);
      }
      dVar10 = (double)((long)givens_s + 1);
      local_38 = local_48[(long)givens_s + (long)(SUB84(givens_s,0) * cols)];
      local_70 = local_48[(long)givens_s + (long)(SUB84(dVar10,0) * cols)];
      matrix_givens_rotation<double>(&local_38,&local_70,&beta,&givens_c,epsilon);
      if (0 < cols) {
        uVar11 = 0;
        do {
          dVar18 = pdVar16[uVar11];
          dVar19 = pdVar17[uVar11];
          pdVar16[uVar11] = beta * dVar18 + dVar19 * -givens_c;
          pdVar17[uVar11] = dVar18 * givens_c + dVar19 * beta;
          uVar11 = uVar11 + 1;
        } while (local_50 != uVar11);
      }
      if (0 < (int)local_3c) {
        pdVar6 = pdVar13;
        uVar11 = uVar9;
        do {
          dVar18 = pdVar6[-1];
          pdVar6[-1] = beta * dVar18 + *pdVar6 * -givens_c;
          *pdVar6 = dVar18 * givens_c + *pdVar6 * beta;
          pdVar6 = pdVar6 + lVar8;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      if ((long)givens_s < (long)(SUB84(dVar2,0) + -2)) {
        local_38 = local_48[(long)givens_s * lVar8 + (long)dVar10];
        local_70 = pdVar1[(long)givens_s + (long)givens_s * lVar8 + 2];
      }
      local_b8 = local_b8 + 1;
      pdVar17 = pdVar17 + lVar8;
      pdVar16 = pdVar16 + lVar8;
    } while ((long)dVar10 <
             (long)buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  }
  if (local_f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_f8);
  }
  return;
}

Assistant:

void
matrix_gk_svd_step (int rows, int cols, T* mat_b, T* mat_q, T* mat_p,
    int p, int q, T const& epsilon)
{
    int const slice_length = cols - q - p;
    int const mat_sizes = slice_length * slice_length;
    std::vector<T> buffer(3 * mat_sizes);
    T* mat_b22 = &buffer[0];
    T* mat_b22_t = mat_b22 + mat_sizes;
    T* mat_tmp = mat_b22_t + mat_sizes;

    for (int i = 0; i < slice_length; ++i)
        for (int j = 0; j < slice_length; ++j)
            mat_b22[i * slice_length + j] = mat_b[(p + i) *  cols + (p + j)];
    for (int i = 0; i < slice_length; ++i)
        for (int j = 0; j < slice_length; ++j)
            mat_b22_t[i * slice_length + j] = mat_b22[j * slice_length + i];

    /* Slice outer product gives covariance matrix. */
    matrix_multiply(mat_b22, slice_length, slice_length, mat_b22_t,
        slice_length, mat_tmp);

    T mat_c[2 * 2];
    mat_c[0] = mat_tmp[(slice_length - 2) * slice_length + (slice_length - 2)];
    mat_c[1] = mat_tmp[(slice_length - 2) * slice_length + (slice_length - 1)];
    mat_c[2] = mat_tmp[(slice_length - 1) * slice_length + (slice_length - 2)];
    mat_c[3] = mat_tmp[(slice_length - 1) * slice_length + (slice_length - 1)];

    /* Use eigenvalue that is closer to the lower right entry of the slice. */
    T eig_1, eig_2;
    matrix_2x2_eigenvalues(mat_c, &eig_1, &eig_2);

    T diff1 = std::abs(mat_c[3] - eig_1);
    T diff2 = std::abs(mat_c[3] - eig_2);
    T mu = (diff1 < diff2) ? eig_1 : eig_2;

    /* Zero another entry bz applyting givens rotations. */
    int k = p;
    T alpha = mat_b[k * cols + k] * mat_b[k * cols + k] - mu;
    T beta = mat_b[k * cols + k] * mat_b[k * cols + (k + 1)];

    for (int k = p; k < cols - q - 1; ++k)
    {
        T givens_c, givens_s;
        matrix_givens_rotation(alpha, beta, &givens_c, &givens_s, epsilon);
        matrix_apply_givens_column(mat_b, cols, cols, k, k + 1, givens_c,
            givens_s);
        matrix_apply_givens_column(mat_p, cols, cols, k, k + 1, givens_c,
            givens_s);

        alpha = mat_b[k * cols + k];
        beta = mat_b[(k + 1) * cols + k];
        matrix_givens_rotation(alpha, beta, &givens_c, &givens_s, epsilon);
        internal::matrix_apply_givens_row(mat_b, cols, cols, k, k + 1,
            givens_c, givens_s);
        internal::matrix_apply_givens_column(mat_q, rows, cols, k, k + 1,
            givens_c, givens_s);

        if (k < (cols - q - 2))
        {
            alpha = mat_b[k * cols + (k + 1)];
            beta = mat_b[k * cols + (k + 2)];
        }
    }
}